

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMCbArgToReturn(TVMValue *value,int code)

{
  ostream *poVar1;
  LogCheckError _check_err;
  int tcode;
  TVMRetValue rv;
  TVMValue local_198;
  int local_190;
  
  rv.super_TVMPODValue_.type_code_ = 4;
  local_198 = *value;
  local_190 = code;
  tvm::runtime::TVMRetValue::Assign<tvm::runtime::TVMArgValue>(&rv,(TVMArgValue *)&local_198.v_type)
  ;
  tvm::runtime::TVMRetValue::MoveToCHost(&rv,value,&tcode);
  dmlc::LogCheck_EQ(_check_err.str._4_4_,(int)_check_err.str);
  if (CONCAT44(_check_err.str._4_4_,(int)_check_err.str) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198.v_type,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/c_runtime_api.cc"
               ,0x24a);
    poVar1 = std::operator<<((ostream *)&local_198.v_type,"Check failed: ");
    poVar1 = std::operator<<(poVar1,"tcode == code");
    poVar1 = std::operator<<(poVar1,(string *)CONCAT44(_check_err.str._4_4_,(int)_check_err.str));
    std::operator<<(poVar1,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198.v_type);
  }
  dmlc::LogCheckError::~LogCheckError(&_check_err);
  tvm::runtime::TVMRetValue::~TVMRetValue(&rv);
  return 0;
}

Assistant:

int TVMCbArgToReturn(TVMValue* value, int code) {
  API_BEGIN();
  tvm::runtime::TVMRetValue rv;
  rv = tvm::runtime::TVMArgValue(*value, code);
  int tcode;
  rv.MoveToCHost(value, &tcode);
  CHECK_EQ(tcode, code);
  API_END();
}